

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  pointer *language;
  undefined8 config_00;
  bool bVar1;
  ManagedType MVar2;
  char *pcVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char *__s;
  ostream *poVar4;
  cmMakefile *pcVar5;
  pointer this_01;
  string *psVar6;
  allocator<char> local_479;
  string local_478;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  undefined1 local_420 [8];
  string isJMCEnabled;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_3e0 [8];
  cmGeneratorExpression ge;
  string local_3c8;
  char *local_3a8;
  char *jmcExprGen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  char *local_360;
  char *jmc;
  cmMakefile *mf;
  string local_348;
  undefined1 local_328 [8];
  ostringstream e;
  allocator<char> local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  char *standard;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  string local_120;
  char *local_100;
  char *targetFlags_1;
  string local_f0;
  char *local_d0;
  char *targetFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  char *langFlagRegexStr;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string langFlagRegexVar;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  langFlagRegexVar.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"CMAKE_",&local_91);
  std::operator+(&local_70,&local_90,lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,"_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  opts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
  if (opts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"COMPILE_FLAGS",
               (allocator<char> *)
               ((long)&opts_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmGeneratorTarget::GetProperty(target,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&opts_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_100 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1,(string *)langFlagRegexVar.field_2._8_8_,lang);
    AppendCompileOptions
              (this,flags,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&targetFlags);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"COMPILE_FLAGS",(allocator<char> *)((long)&targetFlags_1 + 7));
    pcVar3 = cmGeneratorTarget::GetProperty(target,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&targetFlags_1 + 7));
    local_d0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine
                (pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&targetFlags);
    }
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&targetFlags,(string *)langFlagRegexVar.field_2._8_8_,lang);
    AppendCompileOptions
              (this,flags,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&targetFlags,
               (char *)opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&targetFlags);
  }
  this_00 = cmGeneratorTarget::GetMaxLanguageStandards_abi_cxx11_(target);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_00);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) {
      AddCompilerRequirementFlag(this,flags,target,lang);
      pcVar5 = GetMakefile(this);
      jmc = (char *)pcVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"CMAKE_",lang);
      std::operator+(&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"_COMPILE_OPTIONS_JMC");
      pcVar3 = cmMakefile::GetDefinition(pcVar5,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&jmcExprGen);
      local_360 = pcVar3;
      if ((pcVar3 != (char *)0x0) &&
         (MVar2 = cmGeneratorTarget::GetManagedType(target,(string *)langFlagRegexVar.field_2._8_8_)
         , MVar2 != Managed)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"VS_JUST_MY_CODE_DEBUGGING",
                   (allocator<char> *)
                   ((long)&ge.Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        pcVar3 = cmGeneratorTarget::GetProperty(target,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&ge.Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        local_3a8 = pcVar3;
        if (pcVar3 != (char *)0x0) {
          cge._M_t.
          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                  )0x0;
          cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)local_3e0,(cmListFileBacktrace *)&cge);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
          cmGeneratorExpression::Parse
                    ((cmGeneratorExpression *)((long)&isJMCEnabled.field_2 + 8),local_3e0);
          this_01 = std::
                    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  *)((long)&isJMCEnabled.field_2 + 8));
          config_00 = langFlagRegexVar.field_2._8_8_;
          language = &optVec.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)language);
          psVar6 = cmCompiledGeneratorExpression::Evaluate
                             (this_01,this,(string *)config_00,false,(cmGeneratorTarget *)0x0,
                              (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                              (string *)language);
          std::__cxx11::string::string((string *)local_420,(string *)psVar6);
          std::__cxx11::string::~string
                    ((string *)
                     &optVec.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = cmSystemTools::IsOn((string *)local_420);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
            pcVar3 = local_360;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,pcVar3,&local_479);
            cmSystemTools::ExpandListArgument
                      (&local_478,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_458,false);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator(&local_479);
            AppendCompileOptions
                      (this,flags,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_458,(char *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_458);
          }
          std::__cxx11::string::~string((string *)local_420);
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)((long)&isJMCEnabled.field_2 + 8));
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_3e0);
        }
      }
      mf._4_4_ = 0;
LAB_0044a611:
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    standard = (char *)std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*(&__end1);
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)standard,
                   "_STANDARD");
    __s = cmGeneratorTarget::GetProperty(target,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    pcVar3 = standard;
    local_168 = __s;
    if (__s != (char *)0x0) {
      pcVar5 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,__s,&local_1a9);
      bVar1 = cmMakefile::IsLaterStandard
                        (pcVar5,(string *)pcVar3,&local_1a8,(string *)(standard + 0x20));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        poVar4 = std::operator<<((ostream *)local_328,"The COMPILE_FEATURES property of target \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)standard);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" was \"");
        poVar4 = std::operator<<(poVar4,(string *)(standard + 0x20));
        poVar4 = std::operator<<(poVar4,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)standard);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" \"");
        poVar4 = std::operator<<(poVar4,local_168);
        poVar4 = std::operator<<(poVar4,
                                 "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        mf._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        goto LAB_0044a611;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    // (Re-)Escape these flags.  COMPILE_FLAGS were already parsed
    // as a command line above, and COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts, langFlagRegexStr);
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts);
  }

  for (auto const& it : target->GetMaxLanguageStandards()) {
    const char* standard = target->GetProperty(it.first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it.first, standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (const char* jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (char const* jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        cmGeneratorExpression ge;
        std::unique_ptr<cmCompiledGeneratorExpression> cge =
          ge.Parse(jmcExprGen);
        std::string isJMCEnabled = cge->Evaluate(this, config);
        if (cmSystemTools::IsOn(isJMCEnabled)) {
          std::vector<std::string> optVec;
          cmSystemTools::ExpandListArgument(jmc, optVec);
          this->AppendCompileOptions(flags, optVec);
        }
      }
    }
  }
}